

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void print_usage(char *argv_0)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  if (argv_0 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070b8);
  }
  else {
    sVar1 = strlen(argv_0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,argv_0,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," n_1 n_2 ... n_N\tSort {n_i}.",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  if (argv_0 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070b8);
  }
  else {
    sVar1 = strlen(argv_0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,argv_0,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," --stl_test\tTest stl-container sorting.",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  if (argv_0 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070b8);
  }
  else {
    sVar1 = strlen(argv_0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,argv_0,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," --test N max_size\tSort N lists of size less than max_size.",
             0x3b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  if (argv_0 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070b8);
  }
  else {
    sVar1 = strlen(argv_0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,argv_0,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             " --resort N size\tSort nearly-ordered list of given size N times.",0x40);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  return;
}

Assistant:

void print_usage(char *argv_0) {
	std::cout << "Usage: " << argv_0 << " n_1 n_2 ... n_N\tSort {n_i}." << std::endl;
	std::cout << "Usage: " << argv_0 << " --stl_test\tTest stl-container sorting." << std::endl;
	std::cout << "Usage: " << argv_0 << " --test N max_size\tSort N lists of size less than max_size." << std::endl;
	std::cout << "Usage: " << argv_0 << " --resort N size\tSort nearly-ordered list of given size N times." << std::endl;
}